

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hh
# Opt level: O3

string * __thiscall
phosg::join<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char_const*>
          (string *__return_storage_ptr__,phosg *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *items,char **delim)

{
  undefined8 *puVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar3 = *(undefined8 **)(this + 0x10);
  puVar1 = *(undefined8 **)(this + 0x30);
  if (puVar3 != puVar1) {
    puVar4 = *(undefined8 **)(this + 0x20);
    lVar2 = *(long *)(this + 0x28);
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,
                   (char *)(items->
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Deque_impl_data._M_map);
      }
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(char *)*puVar3,puVar3[1]);
      puVar3 = puVar3 + 4;
      if (puVar3 == puVar4) {
        puVar3 = *(undefined8 **)(lVar2 + 8);
        lVar2 = lVar2 + 8;
        puVar4 = puVar3 + 0x40;
      }
    } while (puVar3 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const ItemContainerT& items, DelimiterT& delim) {
  std::string ret;
  for (const auto& item : items) {
    if (!ret.empty()) {
      ret += delim;
    }
    ret += item;
  }
  return ret;
}